

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

uint __thiscall QXmlStreamReaderPrivate::getChar_helper(QXmlStreamReaderPrivate *this)

{
  ArrayOptions *pAVar1;
  QString *this_00;
  QByteArray *other;
  Data *pDVar2;
  QIODevice *this_01;
  Interface *data;
  char16_t *pcVar3;
  QArrayData *data_00;
  Data *pDVar4;
  long lVar5;
  size_t sVar6;
  optional<QStringConverter::Encoding> oVar7;
  size_t in_RCX;
  ulong uVar8;
  uint uVar9;
  qsizetype qVar10;
  long in_FS_OFFSET;
  QByteArrayView data_01;
  QByteArrayView in;
  undefined1 local_68 [8];
  char16_t *pcStack_60;
  qsizetype qStack_58;
  qsizetype local_50;
  anon_union_16_2_cfafc8b3_for_State_4 aStack_48;
  ClearDataFn p_Stack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this->characterOffset = this->characterOffset + this->readBufferPos;
  this->readBufferPos = 0;
  this_00 = &this->readBuffer;
  if ((this->readBuffer).d.size != 0) {
    QString::resize(this_00,0);
  }
  if ((this->decoder).super_QStringConverter.iface != (Interface *)0x0) {
    this->nbytesread = 0;
  }
  if (this->device == (QIODevice *)0x0) {
    other = &this->dataBuffer;
    if (this->nbytesread == 0) {
      QByteArray::operator=(&this->rawReadBuffer,other);
    }
    else {
      QByteArray::append(&this->rawReadBuffer,other);
    }
    this->nbytesread = (this->rawReadBuffer).d.size;
    QByteArray::clear(other);
  }
  else {
    QByteArray::resize(&this->rawReadBuffer,0x2000);
    pDVar2 = (this->rawReadBuffer).d.d;
    this_01 = this->device;
    if ((pDVar2 == (Data *)0x0) ||
       (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData(&this->rawReadBuffer,(this->rawReadBuffer).d.size,KeepSize);
    }
    sVar6 = QIODevice::read(this_01,(int)(this->rawReadBuffer).d.ptr + (int)this->nbytesread,
                            (void *)(0x2000 - this->nbytesread),in_RCX);
    in_RCX = 0;
    if (0 < (long)sVar6) {
      in_RCX = sVar6;
    }
    this->nbytesread = this->nbytesread + in_RCX;
  }
  if (this->nbytesread != 0) {
    if ((this->decoder).super_QStringConverter.iface == (Interface *)0x0) {
      if (this->nbytesread < 4) goto LAB_003a13af;
      data_01.m_data = (storage_type *)0x3c;
      data_01.m_size = (qsizetype)(this->rawReadBuffer).d.ptr;
      oVar7 = QStringConverter::encodingForData
                        ((QStringConverter *)(this->rawReadBuffer).d.size,data_01,(char16_t)in_RCX);
      uVar8 = 0;
      if (((ulong)oVar7.super__Optional_base<QStringConverter::Encoding,_true,_true>._M_payload.
                  super__Optional_payload_base<QStringConverter::Encoding> >> 0x20 & 1) != 0) {
        uVar8 = (ulong)oVar7.super__Optional_base<QStringConverter::Encoding,_true,_true>._M_payload
                       .super__Optional_payload_base<QStringConverter::Encoding> & 0xffffffff;
      }
      local_68 = (undefined1  [8])(QStringConverter::encodingInterfaces + uVar8);
      pcStack_60 = (char16_t *)0x0;
      qStack_58 = 0;
      local_50 = 0;
      aStack_48.d[0] = (void *)0x0;
      aStack_48.d[1] = (void *)0x0;
      p_Stack_38 = (ClearDataFn)0x0;
      (this->decoder).super_QStringConverter.iface = (Interface *)local_68;
      QStringConverterBase::State::clear(&(this->decoder).super_QStringConverter.state);
      (this->decoder).super_QStringConverter.state.flags.
      super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
      super_QFlagsStorage<QStringConverterBase::Flag>.i = (Int)pcStack_60._0_4_;
      (this->decoder).super_QStringConverter.state.remainingChars = qStack_58;
      (this->decoder).super_QStringConverter.state.invalidChars = local_50;
      (this->decoder).super_QStringConverter.state.field_4.d[0] = aStack_48.d[0];
      (this->decoder).super_QStringConverter.state.field_4.d[1] = aStack_48.d[1];
      (this->decoder).super_QStringConverter.state.clearFn = p_Stack_38;
      p_Stack_38 = (ClearDataFn)0x0;
      QStringConverterBase::State::clear((State *)&pcStack_60);
    }
    in.m_data = (this->rawReadBuffer).d.ptr;
    in.m_size = this->nbytesread;
    QStringDecoder::decodeAsString((QString *)local_68,&this->decoder,in);
    data = (Interface *)(this->readBuffer).d.d;
    pcVar3 = (this->readBuffer).d.ptr;
    (this->readBuffer).d.d = (Data *)local_68;
    (this->readBuffer).d.ptr = pcStack_60;
    qVar10 = (this->readBuffer).d.size;
    (this->readBuffer).d.size = qStack_58;
    local_68 = (undefined1  [8])data;
    pcStack_60 = pcVar3;
    qStack_58 = qVar10;
    if (data != (Interface *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&data->name)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&data->name)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&data->name)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)data,2,0x10);
      }
    }
    if (((this->field_0x3a9 & 8) != 0) &&
       ((this->decoder).super_QStringConverter.state.invalidChars != 0)) {
      uVar9 = 0xffffffff;
      QCoreApplication::translate
                ((QString *)local_68,"QXmlStream","Encountered incorrectly encoded content.",
                 (char *)0x0,-1);
      this->error = NotWellFormedError;
      QString::operator=(&this->errorString,(QString *)local_68);
      this->type = Invalid;
      if (local_68 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)(char **)local_68 = *(int *)(char **)local_68 + -1;
        UNLOCK();
        if (*(int *)(char **)local_68 == 0) {
          QArrayData::deallocate((QArrayData *)local_68,2,0x10);
        }
      }
      if ((this->readBuffer).d.ptr != (char16_t *)0x0) {
        data_00 = &((this_00->d).d)->super_QArrayData;
        (this_00->d).d = (Data *)0x0;
        (this->readBuffer).d.ptr = (char16_t *)0x0;
        (this->readBuffer).d.size = 0;
        if (data_00 != (QArrayData *)0x0) {
          LOCK();
          (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
               (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data_00,2,0x10);
          }
        }
      }
      goto LAB_003a13bb;
    }
    pDVar4 = (this_00->d).d;
    if ((pDVar4 == (Data *)0x0) ||
       ((1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ||
        ((pDVar4->super_QArrayData).alloc -
         ((long)((long)(this->readBuffer).d.ptr -
                ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1)
         < 2)))) {
      lVar5 = (this->readBuffer).d.size;
      qVar10 = 1;
      if (1 < lVar5) {
        qVar10 = lVar5;
      }
      QString::reallocData(this_00,qVar10,KeepSize);
    }
    pDVar4 = (this_00->d).d;
    if ((pDVar4 != (Data *)0x0) && ((pDVar4->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar4->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    lVar5 = this->readBufferPos;
    if (lVar5 < (this->readBuffer).d.size) {
      this->readBufferPos = lVar5 + 1;
      uVar9 = (uint)(ushort)(this->readBuffer).d.ptr[lVar5];
      goto LAB_003a13bb;
    }
  }
LAB_003a13af:
  this->atEnd = true;
  uVar9 = 0xffffffff;
LAB_003a13bb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return uVar9;
}

Assistant:

uint QXmlStreamReaderPrivate::getChar_helper()
{
    constexpr qsizetype BUFFER_SIZE = 8192;
    characterOffset += readBufferPos;
    readBufferPos = 0;
    if (readBuffer.size())
        readBuffer.resize(0);
    if (decoder.isValid())
        nbytesread = 0;
    if (device) {
        rawReadBuffer.resize(BUFFER_SIZE);
        qint64 nbytesreadOrMinus1 = device->read(rawReadBuffer.data() + nbytesread, BUFFER_SIZE - nbytesread);
        nbytesread += qMax(nbytesreadOrMinus1, qint64{0});
    } else {
        if (nbytesread)
            rawReadBuffer += dataBuffer;
        else
            rawReadBuffer = dataBuffer;
        nbytesread = rawReadBuffer.size();
        dataBuffer.clear();
    }
    if (!nbytesread) {
        atEnd = true;
        return StreamEOF;
    }

    if (!decoder.isValid()) {
        if (nbytesread < 4) { // the 4 is to cover 0xef 0xbb 0xbf plus
                              // one extra for the utf8 codec
            atEnd = true;
            return StreamEOF;
        }
        auto encoding = QStringDecoder::encodingForData(rawReadBuffer, char16_t('<'));
        if (!encoding)
            // assume utf-8
            encoding = QStringDecoder::Utf8;
        decoder = QStringDecoder(*encoding);
    }

    readBuffer = decoder(QByteArrayView(rawReadBuffer).first(nbytesread));

    if (lockEncoding && decoder.hasError()) {
        raiseWellFormedError(QXmlStream::tr("Encountered incorrectly encoded content."));
        readBuffer.clear();
        return StreamEOF;
    }

    readBuffer.reserve(1); // keep capacity when calling resize() next time

    if (readBufferPos < readBuffer.size()) {
        ushort c = readBuffer.at(readBufferPos++).unicode();
        return c;
    }

    atEnd = true;
    return StreamEOF;
}